

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

void CoreML::Specification::protobuf_Model_2eproto::TableStruct::Shutdown(void)

{
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::Pipeline>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::Pipeline> *)_Pipeline_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::PipelineClassifier>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::PipelineClassifier> *)
           _PipelineClassifier_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::PipelineRegressor>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::PipelineRegressor> *)
           _PipelineRegressor_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::FeatureDescription>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::FeatureDescription> *)
           _FeatureDescription_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::Metadata>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::Metadata> *)_Metadata_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::ModelDescription>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::ModelDescription> *)
           _ModelDescription_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::SerializedModel>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::SerializedModel> *)
           _SerializedModel_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::Model>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::Model> *)_Model_default_instance_);
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _Pipeline_default_instance_.Shutdown();
  _PipelineClassifier_default_instance_.Shutdown();
  _PipelineRegressor_default_instance_.Shutdown();
  _FeatureDescription_default_instance_.Shutdown();
  _Metadata_default_instance_.Shutdown();
  _ModelDescription_default_instance_.Shutdown();
  _SerializedModel_default_instance_.Shutdown();
  _Model_default_instance_.Shutdown();
}